

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
StringEqualFailure::StringEqualFailure
          (StringEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,char *expected
          ,char *actual,SimpleString *text)

{
  SimpleString *in_RDI;
  long in_R8;
  long in_R9;
  size_t in_stack_00000020;
  size_t failStartPrintable;
  size_t failStart;
  TestFailure *in_stack_00000038;
  SimpleString printableActual;
  SimpleString printableExpected;
  SimpleString *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff54;
  char in_stack_ffffffffffffff56;
  char in_stack_ffffffffffffff57;
  SimpleString *in_stack_ffffffffffffff60;
  TestFailure *in_stack_ffffffffffffff68;
  long local_88;
  char *in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  TestFailure *in_stack_ffffffffffffffa0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffa0,(UtestShell *)in_stack_ffffffffffffff98,
             (char *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
  in_RDI->buffer_ = (char *)&PTR__StringEqualFailure_00136ba0;
  TestFailure::createUserText(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  SimpleString::operator=
            ((SimpleString *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
             in_stack_ffffffffffffff48);
  SimpleString::~SimpleString((SimpleString *)0x11864b);
  PrintableStringFromOrNull(in_stack_ffffffffffffff88);
  PrintableStringFromOrNull(in_stack_ffffffffffffff88);
  TestFailure::createButWasString(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_RDI);
  SimpleString::operator+=
            ((SimpleString *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
             in_stack_ffffffffffffff48);
  SimpleString::~SimpleString((SimpleString *)0x1186ad);
  if ((in_R8 != 0) && (in_R9 != 0)) {
    for (local_88 = 0; *(char *)(in_R9 + local_88) == *(char *)(in_R8 + local_88);
        local_88 = local_88 + 1) {
    }
    do {
      in_stack_ffffffffffffff57 =
           SimpleString::at((SimpleString *)
                            CONCAT17(in_stack_ffffffffffffff57,
                                     CONCAT16(in_stack_ffffffffffffff56,
                                              CONCAT24(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50))),
                            (size_t)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 = (int)in_stack_ffffffffffffff57;
      in_stack_ffffffffffffff56 =
           SimpleString::at((SimpleString *)
                            CONCAT17(in_stack_ffffffffffffff57,
                                     CONCAT16(in_stack_ffffffffffffff56,
                                              CONCAT24(in_stack_ffffffffffffff54,
                                                       in_stack_ffffffffffffff50))),
                            (size_t)in_stack_ffffffffffffff48);
    } while (in_stack_ffffffffffffff50 == in_stack_ffffffffffffff56);
    TestFailure::createDifferenceAtPosString
              (in_stack_00000038,(SimpleString *)failStart,failStartPrintable,in_stack_00000020);
    SimpleString::operator+=
              ((SimpleString *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,
                                 CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))),
               in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x118821);
  }
  SimpleString::~SimpleString((SimpleString *)0x118847);
  SimpleString::~SimpleString((SimpleString *)0x118851);
  return;
}

Assistant:

StringEqualFailure::StringEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const char* expected, const char* actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString printableExpected = PrintableStringFromOrNull(expected);
    SimpleString printableActual = PrintableStringFromOrNull(actual);

    message_ += createButWasString(printableExpected, printableActual);
    if((expected) && (actual))
    {
        size_t failStart;
        for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
            ;
        size_t failStartPrintable;
        for (failStartPrintable = 0; printableActual.at(failStartPrintable) == printableExpected.at(failStartPrintable); failStartPrintable++)
            ;
        message_ += createDifferenceAtPosString(printableActual, failStartPrintable, failStart);
    }
}